

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void set_want_move_one_win(Am_Object *window,bool want_move)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Ptr ptr;
  Am_Drawonable *pAVar3;
  Am_Drawonable *draw;
  int local_30;
  int local_2c;
  int new_cnt;
  int cnt;
  Am_Value v;
  bool want_move_local;
  Am_Object *window_local;
  
  v.value.long_value._7_1_ = want_move;
  Am_Value::Am_Value((Am_Value *)&new_cnt);
  local_2c = 0;
  local_30 = 0;
  pAVar2 = Am_Object::Peek(window,299,0);
  Am_Value::operator=((Am_Value *)&new_cnt,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&new_cnt);
  if (bVar1) {
    local_2c = Am_Value::operator_cast_to_int((Am_Value *)&new_cnt);
  }
  if ((v.value.long_value._7_1_ & 1) == 0) {
    if (0 < local_2c) {
      local_30 = local_2c + -1;
    }
  }
  else {
    local_30 = local_2c + 1;
  }
  Am_Object::Set(window,299,local_30,1);
  if (((v.value.long_value._7_1_ & 1) != 0) || (local_2c < 2)) {
    pAVar2 = Am_Object::Get(window,0x7d2,0);
    ptr = Am_Value::operator_cast_to_void_(pAVar2);
    pAVar3 = Am_Drawonable::Narrow(ptr);
    if (pAVar3 != (Am_Drawonable *)0x0) {
      (*pAVar3->_vptr_Am_Drawonable[0x32])(pAVar3,(ulong)((byte)v.value.long_value._7_1_ & 1));
    }
  }
  Am_Value::~Am_Value((Am_Value *)&new_cnt);
  return;
}

Assistant:

void
set_want_move_one_win(Am_Object window, bool want_move)
{
  Am_Value v;
  int cnt = 0;
  int new_cnt = 0;
  v = window.Peek(Am_WINDOW_WANT_MOVE_CNT);
  if (v.Valid())
    cnt = v;
  if (want_move)
    new_cnt = cnt + 1;
  else if (cnt > 0)
    new_cnt = cnt - 1;

  window.Set(Am_WINDOW_WANT_MOVE_CNT, new_cnt, Am_OK_IF_NOT_THERE);
  //call if turning moving on, or if turning off and the count is 1 or less
  if (want_move || cnt <= 1) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
    if (draw)
      draw->Set_Want_Move(want_move);
  }
}